

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pk8.cc
# Opt level: O3

int do_pk8pkey(BIO *bp,EVP_PKEY *x,int isder,int nid,EVP_CIPHER *enc,char *pass,int pass_len,
              pem_password_cb *cb,void *u)

{
  int iVar1;
  PKCS8_PRIV_KEY_INFO *p8inf;
  X509_SIG *p8;
  char buf [1024];
  char local_438 [1032];
  
  p8inf = EVP_PKEY2PKCS8((EVP_PKEY *)x);
  if (p8inf == (PKCS8_PRIV_KEY_INFO *)0x0) {
    ERR_put_error(9,0,0x6a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                  ,0x45);
    return 0;
  }
  if (nid == -1 && enc == (EVP_CIPHER *)0x0) {
    if (isder == 0) {
      iVar1 = PEM_ASN1_write_bio(pem_write_bio_PKCS8_PRIV_KEY_INFO_i2d,"PRIVATE KEY",(BIO *)bp,p8inf
                                 ,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0);
    }
    else {
      iVar1 = i2d_PKCS8_PRIV_KEY_INFO_bio((BIO *)bp,p8inf);
    }
LAB_004780f2:
    PKCS8_PRIV_KEY_INFO_free(p8inf);
    return iVar1;
  }
  if (pass == (char *)0x0) {
    if (cb == (pem_password_cb *)0x0) {
      cb = PEM_def_callback;
    }
    pass_len = (*cb)(local_438,0x400,1,u);
    if (pass_len < 0) {
      iVar1 = 0;
      ERR_put_error(9,0,0x6f,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                    ,0x4f);
      goto LAB_004780f2;
    }
    p8 = PKCS8_encrypt(nid,(EVP_CIPHER *)enc,local_438,pass_len,(uchar *)0x0,0,0,p8inf);
  }
  else {
    p8 = PKCS8_encrypt(nid,(EVP_CIPHER *)enc,pass,pass_len,(uchar *)0x0,0,0,p8inf);
    if (local_438 != pass) goto LAB_004780a7;
  }
  OPENSSL_cleanse(local_438,(long)pass_len);
LAB_004780a7:
  PKCS8_PRIV_KEY_INFO_free(p8inf);
  if (isder == 0) {
    iVar1 = PEM_ASN1_write_bio(pem_write_bio_PKCS8_i2d,"ENCRYPTED PRIVATE KEY",(BIO *)bp,p8,
                               (EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0);
  }
  else {
    iVar1 = i2d_PKCS8_bio((BIO *)bp,p8);
  }
  X509_SIG_free(p8);
  return iVar1;
}

Assistant:

static int do_pk8pkey(BIO *bp, const EVP_PKEY *x, int isder, int nid,
                      const EVP_CIPHER *enc, const char *pass, int pass_len,
                      pem_password_cb *cb, void *u) {
  X509_SIG *p8;
  PKCS8_PRIV_KEY_INFO *p8inf;
  char buf[PEM_BUFSIZE];
  int ret;
  if (!(p8inf = EVP_PKEY2PKCS8(x))) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_ERROR_CONVERTING_PRIVATE_KEY);
    return 0;
  }
  if (enc || (nid != -1)) {
    if (!pass) {
      if (!cb) {
        cb = PEM_def_callback;
      }
      pass_len = cb(buf, PEM_BUFSIZE, 1, u);
      if (pass_len < 0) {
        OPENSSL_PUT_ERROR(PEM, PEM_R_READ_KEY);
        PKCS8_PRIV_KEY_INFO_free(p8inf);
        return 0;
      }

      pass = buf;
    }
    p8 = PKCS8_encrypt(nid, enc, pass, pass_len, NULL, 0, 0, p8inf);
    if (pass == buf) {
      OPENSSL_cleanse(buf, pass_len);
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
    if (isder) {
      ret = i2d_PKCS8_bio(bp, p8);
    } else {
      ret = PEM_write_bio_PKCS8(bp, p8);
    }
    X509_SIG_free(p8);
    return ret;
  } else {
    if (isder) {
      ret = i2d_PKCS8_PRIV_KEY_INFO_bio(bp, p8inf);
    } else {
      ret = PEM_write_bio_PKCS8_PRIV_KEY_INFO(bp, p8inf);
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
    return ret;
  }
}